

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::AllocateTexture(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint8_t uVar1;
  GMM_STATUS GVar2;
  int iVar3;
  GMM_STATUS GVar4;
  undefined1 auStack_88 [8];
  __GMM_BUFFER_TYPE Restrictions;
  
  Restrictions.MaxWidth = 0;
  Restrictions.MaxDepth = 0;
  Restrictions.MaxArraySize = 0;
  Restrictions.MinDepth = 0;
  Restrictions._60_4_ = 0;
  Restrictions.MaxHeight = 0;
  Restrictions.MinHeight = 0;
  Restrictions._44_4_ = 0;
  Restrictions.MinWidth = 0;
  Restrictions.MaxPitch = 0;
  Restrictions.MinAllocationSize = 0;
  Restrictions.RenderPitchAlignment = 0;
  Restrictions.LockPitchAlignment = 0;
  Restrictions.MinPitch = 0;
  Restrictions._20_4_ = 0;
  auStack_88._0_4_ = 0;
  auStack_88._4_4_ = 0;
  Restrictions.Alignment = 0;
  Restrictions.PitchAlignment = 0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  if (this->pGmmLibContext == (Context *)0x0) {
    return GMM_ERROR;
  }
  GetTexRestrictions(this,pTexInfo,(__GMM_BUFFER_TYPE *)auStack_88);
  GVar2 = __GmmTexFillHAlignVAlign(pTexInfo,this->pGmmLibContext);
  if (GVar2 != GMM_SUCCESS) {
    return GVar2;
  }
  uVar1 = GmmIsPlanar(pTexInfo->Format);
  if (uVar1 == '\0') {
    SetTileMode(this,pTexInfo);
    switch(pTexInfo->Type) {
    case RESOURCE_1D:
      GVar2 = (*this->_vptr_GmmTextureCalc[0x11])(this,pTexInfo,auStack_88);
      break;
    case RESOURCE_2D:
    case RESOURCE_PRIMARY:
    case RESOURCE_SHADOW:
    case RESOURCE_STAGING:
    case RESOURCE_NNDI:
    case RESOURCE_HARDWARE_MBM:
    case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
    case RESOURCE_GDI:
    case RESOURCE_IFFS_MAPTOGTT:
      GVar2 = (*this->_vptr_GmmTextureCalc[0x12])(this,pTexInfo,auStack_88);
      break;
    case RESOURCE_3D:
      GVar2 = (*this->_vptr_GmmTextureCalc[0x13])(this,pTexInfo,auStack_88);
      break;
    case RESOURCE_CUBE:
      GVar2 = (*this->_vptr_GmmTextureCalc[0x14])(this,pTexInfo,auStack_88);
      break;
    case RESOURCE_SCRATCH:
    case RESOURCE_BUFFER:
    case RESOURCE_CURSOR:
    case RESOURCE_FBC:
    case RESOURCE_PWR_CONTEXT:
    case RESOURCE_PERF_DATA_QUEUE:
    case RESOURCE_KMD_BUFFER:
    case RESOURCE_HW_CONTEXT:
    case RESOURCE_TAG_PAGE:
    case RESOURCE_OVERLAY_DMA:
    case RESOURCE_GTT_TRANSFER_REGION:
    case RESOURCE_GLOBAL_BUFFER:
    case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
    case RESOURCE_GFX_CLIENT_BUFFER:
      GVar2 = FillTexBlockMem(this,pTexInfo,(__GMM_BUFFER_TYPE *)auStack_88);
      break;
    default:
      return GMM_INVALIDPARAM;
    }
  }
  else {
    GVar2 = (**this->_vptr_GmmTextureCalc)(this,pTexInfo,auStack_88);
    if (GVar2 != GMM_SUCCESS) goto LAB_001b8e3f;
  }
  if ((ulong)Restrictions._16_8_ < pTexInfo->Pitch) {
    return GMM_ERROR;
  }
LAB_001b8e3f:
  iVar3 = (*this->_vptr_GmmTextureCalc[0xe])(this,pTexInfo,pTexInfo);
  GVar4 = GMM_ERROR;
  if (iVar3 == 0) {
    GVar4 = GVar2;
  }
  return GVar4;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::AllocateTexture(GMM_TEXTURE_INFO *pTexInfo)
{
    __GMM_BUFFER_TYPE Restrictions = {0};
    GMM_STATUS        Status;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pGmmLibContext, GMM_ERROR);

    GMM_DPF_ENTER;

    GetTexRestrictions(pTexInfo, &Restrictions);

    if((Status = __GmmTexFillHAlignVAlign(pTexInfo, pGmmLibContext)) != GMM_SUCCESS)
    {
        return Status;
    }

    // Planar YUV resources treated special. Packed YUV treated like 2D/3D/Cube...
    if(GmmIsPlanar(pTexInfo->Format))
    {
        Status = FillTexPlanar(pTexInfo, &Restrictions);

        if((Status == GMM_SUCCESS) &&
           (ValidateTexInfo(pTexInfo, &Restrictions) == false))
        {
            return GMM_ERROR;
        }
        if(GMM_SUCCESS != FillTexCCS(pTexInfo, pTexInfo))
        {
            return GMM_ERROR;
        }
        return Status;
    }
    else
    {
        SetTileMode(pTexInfo);
    }

    switch(pTexInfo->Type)
    {
        case RESOURCE_2D:
        case RESOURCE_PRIMARY:
        case RESOURCE_SHADOW:
        case RESOURCE_STAGING:
        case RESOURCE_GDI:
        case RESOURCE_NNDI:
        case RESOURCE_HARDWARE_MBM:
        case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
        case RESOURCE_IFFS_MAPTOGTT:
#if _WIN32
        case RESOURCE_WGBOX_ENCODE_DISPLAY:
        case RESOURCE_WGBOX_ENCODE_REFERENCE:
#endif
        {
            Status = FillTex2D(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_1D:
        {
            Status = FillTex1D(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_3D:
        {
            Status = FillTex3D(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_CUBE:
        {
            Status = FillTexCube(pTexInfo, &Restrictions);

            break;
        }
        case RESOURCE_SCRATCH:
        case RESOURCE_BUFFER:
        case RESOURCE_FBC:
        case RESOURCE_PWR_CONTEXT:
        case RESOURCE_KMD_BUFFER:
        case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
        case RESOURCE_PERF_DATA_QUEUE:
        case RESOURCE_HW_CONTEXT:
        case RESOURCE_TAG_PAGE:
        case RESOURCE_OVERLAY_DMA:
        case RESOURCE_GTT_TRANSFER_REGION:
        case RESOURCE_GLOBAL_BUFFER:
        case RESOURCE_CURSOR:
        case RESOURCE_GFX_CLIENT_BUFFER:
#if _WIN32
        case RESOURCE_WGBOX_ENCODE_STATE:
        case RESOURCE_WGBOX_ENCODE_TFD:
#endif
        {
            Status = FillTexBlockMem(pTexInfo, &Restrictions);
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "GmmTexAlloc: Unknown surface type!");
            return GMM_INVALIDPARAM;
        }
    };

    if(ValidateTexInfo(pTexInfo, &Restrictions) == false)
    {
        return GMM_ERROR;
    }

    if(GMM_SUCCESS != FillTexCCS(pTexInfo, pTexInfo))
    {
        return GMM_ERROR;
    }

    return Status;
}